

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O0

size_t u32CLZ_fast(u32 w)

{
  size_t local_20;
  u32 t;
  size_t l;
  u32 w_local;
  
  l = 0x20;
  w_local = w;
  if (w >> 0x10 != 0) {
    l = 0x10;
    w_local = w >> 0x10;
  }
  if (w_local >> 8 != 0) {
    l = l - 8;
    w_local = w_local >> 8;
  }
  if (w_local >> 4 != 0) {
    l = l - 4;
    w_local = w_local >> 4;
  }
  if (w_local >> 2 != 0) {
    l = l - 2;
    w_local = w_local >> 2;
  }
  if (w_local >> 1 == 0) {
    local_20 = l - (long)(int)(uint)(w_local != 0);
  }
  else {
    local_20 = l - 2;
  }
  return local_20;
}

Assistant:

size_t FAST(u32CLZ)(register u32 w)
{
	register size_t l = 32;
	register u32 t;
	// дихотомия
	if (t = w >> 16)
		l -= 16, w = t;
	if (t = w >> 8)
		l -= 8, w = t;
	if (t = w >> 4)
		l -= 4, w = t;
	if (t = w >> 2)
		l -= 2, w = t;
	// возврат
	t = 0;
	return (w >> 1) ? l - 2 : l - (w ? 1 : 0);
}